

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O2

void __thiscall wasm::WasmBinaryBuilder::readGlobals(WasmBinaryBuilder *this)

{
  Module *this_00;
  WasmBinaryBuilder *this_01;
  bool bVar1;
  uint32_t uVar2;
  ostream *poVar3;
  Expression *pEVar4;
  Name name;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  IString local_68;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> local_58;
  Expression *local_50;
  ulong local_48;
  ulong local_40;
  WasmBinaryBuilder *local_38;
  
  bVar1 = isDebugEnabled("binary");
  if (bVar1) {
    std::operator<<((ostream *)&std::cerr,"== readGlobals\n");
  }
  local_38 = this;
  uVar2 = getU32LEB(this);
  local_40 = (ulong)uVar2;
  bVar1 = isDebugEnabled("binary");
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"num: ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  local_48 = 0;
  while( true ) {
    if (local_40 == local_48) {
      return;
    }
    bVar1 = isDebugEnabled("binary");
    if (bVar1) {
      std::operator<<((ostream *)&std::cerr,"read one\n");
    }
    this_01 = local_38;
    local_50 = (Expression *)getConcreteType(local_38);
    uVar2 = getU32LEB(this_01);
    if (1 < uVar2) break;
    pEVar4 = readExpression(this_01);
    this_00 = this_01->wasm;
    std::__cxx11::to_string(&local_88,local_48);
    std::operator+(&local_a8,"global$",&local_88);
    IString::IString(&local_68,&local_a8);
    name.super_IString.str._M_str = (char *)local_68.str._M_len;
    name.super_IString.str._M_len = (size_t)&local_58;
    Builder::makeGlobal(name,(Type)local_68.str._M_str,local_50,(Mutability)pEVar4);
    Module::addGlobal(this_00,&local_58);
    std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::~unique_ptr(&local_58);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_88);
    local_48 = local_48 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"Global mutability must be 0 or 1",(allocator<char> *)&local_a8);
  throwError(local_38,&local_c8);
}

Assistant:

void WasmBinaryBuilder::readGlobals() {
  BYN_TRACE("== readGlobals\n");
  size_t num = getU32LEB();
  BYN_TRACE("num: " << num << std::endl);
  for (size_t i = 0; i < num; i++) {
    BYN_TRACE("read one\n");
    auto type = getConcreteType();
    auto mutable_ = getU32LEB();
    if (mutable_ & ~1) {
      throwError("Global mutability must be 0 or 1");
    }
    auto* init = readExpression();
    wasm.addGlobal(
      Builder::makeGlobal("global$" + std::to_string(i),
                          type,
                          init,
                          mutable_ ? Builder::Mutable : Builder::Immutable));
  }
}